

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O3

NativeDisplayFactory *
eglu::selectNativeDisplayFactory(NativeDisplayFactoryRegistry *registry,CommandLine *cmdLine)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  NativeDisplayFactory *pNVar5;
  AbstractFactory *pAVar6;
  undefined4 extraout_var;
  FactoryBase *this;
  NotSupportedError *pNVar7;
  long *plVar8;
  long *plVar9;
  size_type *psVar10;
  size_t index;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pcVar3 = tcu::CommandLine::getEGLDisplayType(cmdLine);
  if (pcVar3 == (char *)0x0) {
    if ((registry->m_registry).m_factories.
        super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (registry->m_registry).m_factories.
        super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar5 = (NativeDisplayFactory *)
               tcu::GenericFactoryRegistry::getFactoryByIndex(&registry->m_registry,0);
      return pNVar5;
    }
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"No factory supporting EGL \'","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_90 = (long *)*plVar8;
    plVar9 = plVar8 + 2;
    if (local_90 == plVar9) {
      local_80 = *plVar9;
      lStack_78 = plVar8[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar9;
    }
    local_88 = plVar8[1];
    *plVar8 = (long)plVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d0._M_dataplus._M_p = (pointer)*plVar8;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar10) {
      local_d0.field_2._M_allocated_capacity = *psVar10;
      local_d0.field_2._8_8_ = plVar8[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar10;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError
              (pNVar7,local_d0._M_dataplus._M_p,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x1ce);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  sVar4 = strlen(pcVar3);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar3,pcVar3 + sVar4);
  pNVar5 = (NativeDisplayFactory *)
           tcu::GenericFactoryRegistry::getFactoryByName(&registry->m_registry,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (pNVar5 != (NativeDisplayFactory *)0x0) {
    return pNVar5;
  }
  tcu::print("ERROR: Unknown or unsupported EGL %s type \'%s\'","display",pcVar3);
  tcu::print("Available EGL %s types:\n","display");
  if ((registry->m_registry).m_factories.
      super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (registry->m_registry).m_factories.
      super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index = 0;
    do {
      pAVar6 = tcu::GenericFactoryRegistry::getFactoryByIndex(&registry->m_registry,index);
      iVar2 = (*pAVar6->_vptr_AbstractFactory[2])(pAVar6);
      this = (FactoryBase *)
             tcu::GenericFactoryRegistry::getFactoryByIndex(&registry->m_registry,index);
      pcVar3 = tcu::FactoryBase::getDescription(this);
      tcu::print("  %s: %s\n",CONCAT44(extraout_var,iVar2),pcVar3);
      index = index + 1;
    } while (index < (ulong)((long)(registry->m_registry).m_factories.
                                   super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(registry->m_registry).m_factories.
                                   super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Unsupported or unknown EGL ","");
  plVar8 = (long *)std::__cxx11::string::append((char *)local_70);
  local_50 = (long *)*plVar8;
  plVar9 = plVar8 + 2;
  if (local_50 == plVar9) {
    local_40 = *plVar9;
    lStack_38 = plVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar9;
  }
  local_48 = plVar8[1];
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar8;
  plVar9 = plVar8 + 2;
  if (local_b0 == plVar9) {
    local_a0 = *plVar9;
    lStack_98 = plVar8[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar9;
  }
  local_a8 = plVar8[1];
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_90 = (long *)*plVar8;
  plVar9 = plVar8 + 2;
  if (local_90 == plVar9) {
    local_80 = *plVar9;
    lStack_78 = plVar8[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar9;
  }
  local_88 = plVar8[1];
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_d0._M_dataplus._M_p = (pointer)*plVar8;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar10) {
    local_d0.field_2._M_allocated_capacity = *psVar10;
    local_d0.field_2._8_8_ = plVar8[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar10;
  }
  local_d0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError
            (pNVar7,local_d0._M_dataplus._M_p,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0x1c8);
  __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

const NativeDisplayFactory& selectNativeDisplayFactory (const NativeDisplayFactoryRegistry& registry, const tcu::CommandLine& cmdLine)
{
	return selectFactory(registry, "display", cmdLine.getEGLDisplayType());
}